

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___newindex(lua_State *L)

{
  ulong uVar1;
  CType *d;
  CType *in_RDI;
  TValue *o;
  uint8_t *p;
  CType *ct;
  CTInfo *in_stack_00000018;
  CTInfo qual;
  CTState *cts;
  GCcdata *in_stack_00000030;
  CTState *cts_1;
  TValue *o_00;
  lua_State *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  int local_14;
  
  uVar2._0_2_ = in_RDI->sib;
  uVar2._2_2_ = in_RDI->next;
  uVar1 = (ulong)*(uint *)((ulong)uVar2 + 0x194);
  *(CType **)(uVar1 + 0x10) = in_RDI;
  uVar2 = 0;
  o_00 = *(TValue **)(in_RDI + 1);
  if ((o_00 + 2 < *(TValue **)&in_RDI[1].sib) && ((o_00->field_2).it == 0xfffffff5)) {
    d = lj_cdata_index(cts_1,in_stack_00000030,(cTValue *)L,(uint8_t **)cts,in_stack_00000018);
    if ((uVar2 & 1) == 0) {
      lj_cdata_set((CTState *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),d,
                   (uint8_t *)in_stack_ffffffffffffffc0,o_00,0);
      local_14 = 0;
    }
    else {
      if ((uVar2 & 0x2000000) != 0) {
        lj_err_caller(in_stack_ffffffffffffffc0,(ErrMsg)((ulong)o_00 >> 0x20));
      }
      local_14 = ffi_index_meta((lua_State *)p,(CTState *)&o->field_2,in_RDI,(MMS)(uVar1 >> 0x20));
    }
    return local_14;
  }
  lj_err_argt(in_stack_ffffffffffffffc0,(int)((ulong)o_00 >> 0x20),(int)o_00);
}

Assistant:

LJLIB_CF(ffi_meta___newindex)	LJLIB_REC(cdata_index 1)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+2 < L->top && tviscdata(o)))  /* Also checks for key and value. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1)) {
    if ((qual & CTF_CONST))
      lj_err_caller(L, LJ_ERR_FFI_WRCONST);
    return ffi_index_meta(L, cts, ct, MM_newindex);
  }
  lj_cdata_set(cts, ct, p, o+2, qual);
  return 0;
}